

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_reset_compressedBlockState(ZSTD_compressedBlockState_t *bs)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)bs->rep + lVar1) = *(undefined4 *)((long)repStartValue + lVar1);
  }
  (bs->entropy).huf.repeatMode = HUF_repeat_none;
  (bs->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (bs->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  return;
}

Assistant:

void ZSTD_reset_compressedBlockState(ZSTD_compressedBlockState_t* bs)
{
    int i;
    for (i = 0; i < ZSTD_REP_NUM; ++i)
        bs->rep[i] = repStartValue[i];
    bs->entropy.huf.repeatMode = HUF_repeat_none;
    bs->entropy.fse.offcode_repeatMode = FSE_repeat_none;
    bs->entropy.fse.matchlength_repeatMode = FSE_repeat_none;
    bs->entropy.fse.litlength_repeatMode = FSE_repeat_none;
}